

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<GraphContigger> * __thiscall
pybind11::class_<GraphContigger>::
def<bool(GraphContigger::*)(TangleView&,Strider&,GraphEditor&),pybind11::arg,pybind11::arg,pybind11::arg>
          (class_<GraphContigger> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          arg *extra_1,arg *extra_2)

{
  char *name;
  cpp_function *in_RCX;
  char *in_RDX;
  none *extraout_RDX;
  handle in_RSI;
  handle in_RDI;
  cpp_function cf;
  handle *in_stack_ffffffffffffff28;
  sibling *in_stack_ffffffffffffff30;
  none *this_00;
  is_method *in_stack_ffffffffffffff70;
  name *in_stack_ffffffffffffff78;
  offset_in_Node_to_subr in_stack_ffffffffffffff80;
  PyObject *this_01;
  is_method local_58;
  name in_stack_ffffffffffffffb0;
  arg *extra_4;
  arg *extra_5;
  PyObject *cls;
  
  extra_4 = *(arg **)in_RDX;
  extra_5 = *(arg **)(in_RDX + 8);
  name = (char *)_GraphContigger___pybind11__method_adaptor<GraphContigger,bool,GraphContigger,TangleView&,Strider&,GraphEditor&>_bool_GraphContigger_____TangleView__Strider__GraphEditor____
                           (extra_4,(offset_in_Node_to_subr)extra_5);
  this_00 = extraout_RDX;
  pybind11::name::name((name *)&stack0xffffffffffffffb0,(char *)in_RSI.m_ptr);
  is_method::is_method(&local_58,(handle *)in_RDI.m_ptr);
  this_01 = (PyObject *)(in_RDI.m_ptr)->ob_refcnt;
  cls = in_RSI.m_ptr;
  none::none(this_00);
  getattr(in_RSI,name,in_RDI);
  sibling::sibling(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  cpp_function::
  cpp_function<bool,GraphContigger,TangleView&,Strider&,GraphEditor&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg>
            ((cpp_function *)this_01,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70,(sibling *)this_00,(arg *)in_stack_ffffffffffffffb0.value,
             extra_4,extra_5);
  object::~object((object *)0x2867a5);
  none::~none((none *)0x2867af);
  pybind11::detail::add_class_method((object *)cls,in_RDX,in_RCX);
  cpp_function::~cpp_function((cpp_function *)0x2867d8);
  return (class_<GraphContigger> *)in_RDI.m_ptr;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }